

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O3

void rw::clearMatFX(MatFX *matfx)

{
  anon_struct_40_2_fcac472b *paVar1;
  uint32 uVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  Texture *pTVar6;
  
  lVar4 = 0;
  bVar5 = true;
  do {
    paVar1 = matfx->fx + lVar4;
    uVar2 = paVar1->type;
    if (uVar2 == 4) {
      pTVar6 = (paVar1->field_1).dual.tex;
LAB_0012f558:
      if (pTVar6 != (Texture *)0x0) {
        Texture::destroy(pTVar6);
      }
    }
    else {
      if (uVar2 == 2) {
        pTVar6 = (paVar1->field_1).bump.bumpedTex;
        goto LAB_0012f558;
      }
      if (uVar2 == 1) {
        pTVar6 = (paVar1->field_1).bump.bumpedTex;
        if (pTVar6 != (Texture *)0x0) {
          Texture::destroy(pTVar6);
        }
        pTVar6 = (paVar1->field_1).bump.tex;
        goto LAB_0012f558;
      }
    }
    lVar4 = 1;
    bVar3 = !bVar5;
    bVar5 = false;
    if (bVar3) {
      matfx->fx[1].field_1.bump.tex = (Texture *)0x0;
      *(undefined8 *)((long)&matfx->fx[1].field_1 + 0x18) = 0;
      matfx->fx[1].field_1.bump.frame = (Frame *)0x0;
      matfx->fx[1].field_1.bump.bumpedTex = (Texture *)0x0;
      *(undefined8 *)((long)&matfx->fx[0].field_1 + 0x18) = 0;
      *(undefined8 *)(matfx->fx + 1) = 0;
      matfx->fx[0].field_1.bump.bumpedTex = (Texture *)0x0;
      matfx->fx[0].field_1.bump.tex = (Texture *)0x0;
      *(undefined8 *)matfx->fx = 0;
      matfx->fx[0].field_1.bump.frame = (Frame *)0x0;
      *(undefined8 *)&matfx->type = 0;
      return;
    }
  } while( true );
}

Assistant:

static void
clearMatFX(MatFX *matfx)
{
	for(int i = 0; i < 2; i++)
		switch(matfx->fx[i].type){
		case MatFX::BUMPMAP:
			if(matfx->fx[i].bump.bumpedTex)
				matfx->fx[i].bump.bumpedTex->destroy();
			if(matfx->fx[i].bump.tex)
				matfx->fx[i].bump.tex->destroy();
			break;

		case MatFX::ENVMAP:
			if(matfx->fx[i].env.tex)
				matfx->fx[i].env.tex->destroy();
			break;

		case MatFX::DUAL:
			if(matfx->fx[i].dual.tex)
				matfx->fx[i].dual.tex->destroy();
			break;
		}
	memset(matfx, 0, sizeof(MatFX));
}